

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_chk(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 arg;
  TCGContext_conflict2 *s_00;
  bool bVar1;
  ushort uVar2;
  TCGv_i32 pTVar3;
  TCGTemp *pTVar4;
  TCGv_i32 ret;
  uint32_t dest;
  int iVar5;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar2 = insn >> 7 & 3;
  if (uVar2 == 3) {
    iVar5 = 1;
    bVar1 = false;
  }
  else {
    if ((uVar2 != 2) || ((env->features & 0x2000000) == 0)) {
      dest = (s->base).pc_next;
      iVar5 = 4;
      goto LAB_006f70e3;
    }
    iVar5 = 2;
    bVar1 = true;
  }
  pTVar3 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,iVar5,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,
                       EA_LOADS,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar3 != tcg_ctx->NULL_QREG) {
    arg = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(insn >> 6 & 0x38));
    ret = arg;
    if (!bVar1) {
      s_00 = s->uc->tcg_ctx;
      pTVar4 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
      iVar5 = s->release_count;
      if (7 < (long)iVar5) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                   ,0x91,"s->release_count < MAX_TO_RELEASE");
      }
      ret = (TCGv_i32)((long)pTVar4 - (long)s_00);
      s->release_count = iVar5 + 1;
      s->release[iVar5] = ret;
      tcg_gen_ext16s_i32_m68k(s_00,ret,arg);
    }
    gen_flush_flags(s);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = ret + (long)tcg_ctx;
    local_38 = pTVar3 + (long)tcg_ctx;
    tcg_gen_callN_m68k(tcg_ctx,helper_chk_m68k,(TCGTemp *)0x0,3,&local_48);
    return;
  }
  dest = (s->base).pc_next;
  iVar5 = 3;
LAB_006f70e3:
  gen_exception(s,dest,iVar5);
  return;
}

Assistant:

DISAS_INSN(chk)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src, reg;
    int opsize;

    switch ((insn >> 7) & 3) {
    case 3:
        opsize = OS_WORD;
        break;
    case 2:
        if (m68k_feature(env, M68K_FEATURE_CHK2)) {
            opsize = OS_LONG;
            break;
        }
        /* fallthru */
    default:
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }
    SRC_EA(env, src, opsize, 1, NULL);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);

    gen_flush_flags(s);
    gen_helper_chk(tcg_ctx, tcg_ctx->cpu_env, reg, src);
}